

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaseDecisionDag.h
# Opt level: O0

void __thiscall slang::analysis::CaseDecisionDag::~CaseDecisionDag(CaseDecisionDag *this)

{
  boost::unordered::
  unordered_flat_set<unsigned_int,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~unordered_flat_set
            ((unordered_flat_set<unsigned_int,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)0x23042f);
  boost::unordered::
  unordered_flat_set<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_void>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::~unordered_flat_set
            ((unordered_flat_set<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_void>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              *)0x230440);
  std::optional<slang::SVInt>::~optional((optional<slang::SVInt> *)0x23044e);
  boost::unordered::
  unordered_flat_set<std::pair<unsigned_int,_unsigned_int>,_slang::hash<std::pair<unsigned_int,_unsigned_int>,_void>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~unordered_flat_set
            ((unordered_flat_set<std::pair<unsigned_int,_unsigned_int>,_slang::hash<std::pair<unsigned_int,_unsigned_int>,_void>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)0x23045c);
  boost::unordered::
  unordered_flat_set<unsigned_int,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~unordered_flat_set
            ((unordered_flat_set<unsigned_int,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)0x230466);
  return;
}

Assistant:

class SLANG_EXPORT CaseDecisionDag {
public:
    using ClauseIndex = uint32_t;

    /// Contains the indices of clauses that are never reachable because
    /// some earlier clause subsumes it.
    flat_hash_set<ClauseIndex> unreachableClauses;

    /// Contains pairs of indices that overlap, meaning that some inputs
    /// match both clauses. Clauses that are deemed unreachable are not
    /// included here.
    flat_hash_set<std::pair<ClauseIndex, ClauseIndex>> overlappingClauses;

    /// If the DAG is not exhaustive, this contains a counterexample that
    /// demonstrates a value that is not covered by any of the clauses.
    /// Otherwise, this is empty.
    std::optional<SVInt> counterexample;

    /// If true, analyzing the case clauses took more than maxSteps and so
    /// the analysis was halted.
    bool gaveUp = false;

    /// Constructs a new case decision DAG.
    CaseDecisionDag(std::span<const SVInt> clauses, uint32_t bitWidth, bool wildcardX,
                    uint32_t maxSteps = UINT32_MAX);

    /// Indicates whether the DAG is exhaustive, meaning that all possible
    /// input values are covered by the case statement clauses.
    bool isExhaustive() const { return !counterexample.has_value(); }

private:
    void build(uint32_t level, std::span<const SVInt> clauses, uint32_t bitWidth, bool wildcardX,
               uint32_t maxSteps, SVInt curPath, std::vector<ClauseIndex>&& activeIndices);

    uint32_t steps = 0;

    using MemoKey = std::pair<uint32_t, std::vector<ClauseIndex>>;
    flat_hash_set<MemoKey> visitedKeys;
    flat_hash_set<ClauseIndex> usedIndices;
}